

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

yajl_tok yajl_lex_number(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t *offset)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  uchar *puVar4;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  int numRd;
  yajl_tok tok;
  uchar c;
  bool local_c5;
  byte local_c4;
  bool local_75;
  int local_34;
  yajl_tok local_30;
  byte local_29;
  
  local_30 = yajl_tok_integer;
  if (in_RDX <= *in_RCX) {
    return yajl_tok_eof;
  }
  if (((*(int *)(in_RDI + 0x28) == 0) ||
      (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
     (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
     sVar3 <= uVar1)) {
    uVar1 = *in_RCX;
    *in_RCX = uVar1 + 1;
    local_29 = *(byte *)(in_RSI + uVar1);
  }
  else {
    puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
    lVar2 = *(long *)(in_RDI + 0x20);
    *(long *)(in_RDI + 0x20) = lVar2 + 1;
    local_29 = puVar4[lVar2];
  }
  if (local_29 == 0x2d) {
    if (in_RDX <= *in_RCX) {
      return yajl_tok_eof;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
       (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar3 <= uVar1)) {
      uVar1 = *in_RCX;
      *in_RCX = uVar1 + 1;
      local_29 = *(byte *)(in_RSI + uVar1);
    }
    else {
      puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar2 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar2 + 1;
      local_29 = puVar4[lVar2];
    }
  }
  if (local_29 == 0x30) {
    if (in_RDX <= *in_RCX) {
      return yajl_tok_eof;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
       (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar3 <= uVar1)) {
      uVar1 = *in_RCX;
      *in_RCX = uVar1 + 1;
      local_29 = *(byte *)(in_RSI + uVar1);
    }
    else {
      puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar2 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar2 + 1;
      local_29 = puVar4[lVar2];
    }
  }
  else {
    if ((local_29 < 0x31) || (0x39 < local_29)) {
      if (*in_RCX == 0) {
        *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
      }
      else {
        *in_RCX = *in_RCX - 1;
      }
      *(undefined4 *)(in_RDI + 0x10) = 9;
      return yajl_tok_error;
    }
    do {
      if (in_RDX <= *in_RCX) {
        return yajl_tok_eof;
      }
      if (((*(int *)(in_RDI + 0x28) == 0) ||
          (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
         (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
         sVar3 <= uVar1)) {
        uVar1 = *in_RCX;
        *in_RCX = uVar1 + 1;
        local_29 = *(byte *)(in_RSI + uVar1);
      }
      else {
        puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
        lVar2 = *(long *)(in_RDI + 0x20);
        *(long *)(in_RDI + 0x20) = lVar2 + 1;
        local_29 = puVar4[lVar2];
      }
      local_75 = 0x2f < local_29 && local_29 < 0x3a;
    } while (local_75);
  }
  if (local_29 == 0x2e) {
    local_34 = 0;
    if (in_RDX <= *in_RCX) {
      return yajl_tok_eof;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
       (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar3 <= uVar1)) {
      uVar1 = *in_RCX;
      *in_RCX = uVar1 + 1;
      local_29 = *(byte *)(in_RSI + uVar1);
    }
    else {
      puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar2 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar2 + 1;
      local_29 = puVar4[lVar2];
    }
    while (0x2f < local_29 && local_29 < 0x3a) {
      local_34 = local_34 + 1;
      if (in_RDX <= *in_RCX) {
        return yajl_tok_eof;
      }
      if (((*(int *)(in_RDI + 0x28) == 0) ||
          (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
         (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
         sVar3 <= uVar1)) {
        uVar1 = *in_RCX;
        *in_RCX = uVar1 + 1;
        local_29 = *(byte *)(in_RSI + uVar1);
      }
      else {
        puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
        lVar2 = *(long *)(in_RDI + 0x20);
        *(long *)(in_RDI + 0x20) = lVar2 + 1;
        local_29 = puVar4[lVar2];
      }
    }
    if (local_34 == 0) {
      if (*in_RCX == 0) {
        *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
      }
      else {
        *in_RCX = *in_RCX - 1;
      }
      *(undefined4 *)(in_RDI + 0x10) = 7;
      return yajl_tok_error;
    }
    local_30 = yajl_tok_double;
  }
  if ((local_29 == 0x65) || (local_29 == 0x45)) {
    if (in_RDX <= *in_RCX) {
      return yajl_tok_eof;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
       (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar3 <= uVar1)) {
      uVar1 = *in_RCX;
      *in_RCX = uVar1 + 1;
      local_29 = *(byte *)(in_RSI + uVar1);
    }
    else {
      puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar2 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar2 + 1;
      local_29 = puVar4[lVar2];
    }
    if ((local_29 == 0x2b) || (local_29 == 0x2d)) {
      if (in_RDX <= *in_RCX) {
        return yajl_tok_eof;
      }
      if (((*(int *)(in_RDI + 0x28) == 0) ||
          (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
         (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
         sVar3 <= uVar1)) {
        uVar1 = *in_RCX;
        *in_RCX = uVar1 + 1;
        local_29 = *(byte *)(in_RSI + uVar1);
      }
      else {
        puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
        lVar2 = *(long *)(in_RDI + 0x20);
        *(long *)(in_RDI + 0x20) = lVar2 + 1;
        local_29 = puVar4[lVar2];
      }
    }
    if ((local_29 < 0x30) || (0x39 < local_29)) {
      if (*in_RCX == 0) {
        *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
      }
      else {
        *in_RCX = *in_RCX - 1;
      }
      *(undefined4 *)(in_RDI + 0x10) = 8;
      return yajl_tok_error;
    }
    do {
      if (in_RDX <= *in_RCX) {
        return yajl_tok_eof;
      }
      if (((*(int *)(in_RDI + 0x28) == 0) ||
          (sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar3 == 0)) ||
         (uVar1 = *(ulong *)(in_RDI + 0x20), sVar3 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
         sVar3 <= uVar1)) {
        uVar1 = *in_RCX;
        *in_RCX = uVar1 + 1;
        local_c4 = *(byte *)(in_RSI + uVar1);
      }
      else {
        puVar4 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
        lVar2 = *(long *)(in_RDI + 0x20);
        *(long *)(in_RDI + 0x20) = lVar2 + 1;
        local_c4 = puVar4[lVar2];
      }
      local_c5 = 0x2f < local_c4 && local_c4 < 0x3a;
    } while (local_c5);
    local_30 = yajl_tok_double;
  }
  if (*in_RCX == 0) {
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
  }
  else {
    *in_RCX = *in_RCX - 1;
  }
  return local_30;
}

Assistant:

static yajl_tok
yajl_lex_number(yajl_lexer lexer, const unsigned char * jsonText,
                size_t jsonTextLen, size_t * offset)
{
    /** XXX: numbers are the only entities in json that we must lex
     *       _beyond_ in order to know that they are complete.  There
     *       is an ambiguous case for integers at EOF. */

    unsigned char c;

    yajl_tok tok = yajl_tok_integer;

    RETURN_IF_EOF;
    c = readChar(lexer, jsonText, offset);

    /* optional leading minus */
    if (c == '-') {
        RETURN_IF_EOF;
        c = readChar(lexer, jsonText, offset);
    }

    /* a single zero, or a series of integers */
    if (c == '0') {
        RETURN_IF_EOF;
        c = readChar(lexer, jsonText, offset);
    } else if (c >= '1' && c <= '9') {
        do {
            RETURN_IF_EOF;
            c = readChar(lexer, jsonText, offset);
        } while (c >= '0' && c <= '9');
    } else {
        unreadChar(lexer, offset);
        lexer->error = yajl_lex_missing_integer_after_minus;
        return yajl_tok_error;
    }

    /* optional fraction (indicates this is floating point) */
    if (c == '.') {
        int numRd = 0;

        RETURN_IF_EOF;
        c = readChar(lexer, jsonText, offset);

        while (c >= '0' && c <= '9') {
            numRd++;
            RETURN_IF_EOF;
            c = readChar(lexer, jsonText, offset);
        }

        if (!numRd) {
            unreadChar(lexer, offset);
            lexer->error = yajl_lex_missing_integer_after_decimal;
            return yajl_tok_error;
        }
        tok = yajl_tok_double;
    }

    /* optional exponent (indicates this is floating point) */
    if (c == 'e' || c == 'E') {
        RETURN_IF_EOF;
        c = readChar(lexer, jsonText, offset);

        /* optional sign */
        if (c == '+' || c == '-') {
            RETURN_IF_EOF;
            c = readChar(lexer, jsonText, offset);
        }

        if (c >= '0' && c <= '9') {
            do {
                RETURN_IF_EOF;
                c = readChar(lexer, jsonText, offset);
            } while (c >= '0' && c <= '9');
        } else {
            unreadChar(lexer, offset);
            lexer->error = yajl_lex_missing_integer_after_exponent;
            return yajl_tok_error;
        }
        tok = yajl_tok_double;
    }

    /* we always go "one too far" */
    unreadChar(lexer, offset);

    return tok;
}